

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_WONDER(effect_handler_context_t *context)

{
  undefined1 uVar1;
  wchar_t wVar2;
  code *pcVar3;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  
  wVar2 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  context->ident = true;
  if (L'd' < wVar2) {
    msg("You feel a surge of power!");
    if ((uint)wVar2 < 0x68) {
      pcVar3 = effect_handler_EARTHQUAKE;
    }
    else if ((uint)wVar2 < 0x6a) {
      pcVar3 = effect_handler_DESTRUCTION;
    }
    else if ((uint)wVar2 < 0x6c) {
      pcVar3 = effect_handler_BANISH;
    }
    else {
      if (0x6d < (uint)wVar2) {
        origin._4_4_ = 0;
        origin.what = (context->origin).what;
        origin.which.trap = (context->origin).which.trap;
        effect_simple(L'2',origin,"150",L'*',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        origin_00._4_4_ = 0;
        origin_00.what = (context->origin).what;
        origin_00.which.trap = (context->origin).which.trap;
        effect_simple(L'2',origin_00,"20",L'2',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        origin_01._4_4_ = 0;
        origin_01.what = (context->origin).what;
        origin_01.which.trap = (context->origin).which.trap;
        effect_simple(L'2',origin_01,"40",L'-',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        origin_02._4_4_ = 0;
        origin_02.what = (context->origin).what;
        origin_02.which.trap = (context->origin).which.trap;
        effect_simple(L'\x03',origin_02,"300",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        return true;
      }
      pcVar3 = effect_handler_PROJECT_LOS;
    }
    goto LAB_0013c246;
  }
  pcVar3 = effect_handler_BOLT;
  if ((((wVar2 < L'\b') || ((uint)wVar2 < 0xe)) || ((uint)wVar2 < 0x1a)) || ((uint)wVar2 < 0x1f))
  goto LAB_0013c246;
  if ((uint)wVar2 < 0x24) {
LAB_0013c3f2:
    pcVar3 = effect_handler_BOLT_OR_BEAM;
  }
  else {
    if ((uint)wVar2 < 0x29) goto LAB_0013c246;
    if (0x2d < (uint)wVar2) {
      if ((uint)wVar2 < 0x33) {
        pcVar3 = effect_handler_LINE;
        goto LAB_0013c246;
      }
      if ((uint)wVar2 < 0x38) {
        pcVar3 = effect_handler_BEAM;
        goto LAB_0013c246;
      }
      if ((((uint)wVar2 < 0x3d) || ((uint)wVar2 < 0x42)) || ((uint)wVar2 < 0x47)) goto LAB_0013c3f2;
      if (((uint)wVar2 < 0x4c) ||
         (((0x50 < (uint)wVar2 && (0x55 < (uint)wVar2)) &&
          ((0x5a < (uint)wVar2 && (0x5f < (uint)wVar2)))))) goto LAB_0013c246;
    }
    pcVar3 = effect_handler_BALL;
  }
LAB_0013c246:
  uVar1 = (*pcVar3)();
  return (_Bool)uVar1;
}

Assistant:

bool effect_handler_WONDER(effect_handler_context_t *context)
{
	int plev = player->lev;
	int die = effect_calculate_value(context, false);
	int subtype = 0, radius = 0, other = 0, y = 0, x = 0;
	int beam = context->beam;
	effect_handler_f handler = NULL;
	random_value value = { 0, 0, 0, 0 };

	context->ident = true;

	if (die > 100)
		msg("You feel a surge of power!");

	if (die < 8) {
		subtype = PROJ_MON_CLONE;
		handler = effect_handler_BOLT;
	} else if (die < 14) {
		subtype = PROJ_MON_SPEED;
		value.base = 100;
		handler = effect_handler_BOLT;
	} else if (die < 26) {
		subtype = PROJ_MON_HEAL;
		value.dice = 4;
		value.sides = 6;
		handler = effect_handler_BOLT;
	} else if (die < 31) {
		subtype = PROJ_MON_POLY;
		value.base = plev;
		handler = effect_handler_BOLT;
	} else if (die < 36) {
		beam -= 10;
		subtype = PROJ_MISSILE;
		value.dice = 3 + ((plev - 1) / 5);
		value.sides = 4;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 41) {
		subtype = PROJ_MON_CONF;
		value.base = plev;
		handler = effect_handler_BOLT;
	} else if (die < 46) {
		subtype = PROJ_POIS;
		value.base = 20 + plev / 2;
		radius = 3;
		handler = effect_handler_BALL;
	} else if (die < 51) {
		subtype = PROJ_LIGHT_WEAK;
		value.dice = 6;
		value.sides = 8;
		handler = effect_handler_LINE;
	} else if (die < 56) {
		subtype = PROJ_ELEC;
		value.dice = 3 + ((plev - 5) / 6);
		value.sides = 6;
		handler = effect_handler_BEAM;
	} else if (die < 61) {
		beam -= 10;
		subtype = PROJ_COLD;
		value.dice = 5 + ((plev - 5) / 4);
		value.sides = 8;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 66) {
		subtype = PROJ_ACID;
		value.dice = 6 + ((plev - 5) / 4);
		value.sides = 8;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 71) {
		subtype = PROJ_FIRE;
		value.dice = 8 + ((plev - 5) / 4);
		value.sides = 8;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 76) {
		subtype = PROJ_MON_DRAIN;
		value.base = 75;
		handler = effect_handler_BOLT;
	} else if (die < 81) {
		subtype = PROJ_ELEC;
		value.base = 30 + plev / 2;
		radius = 2;
		handler = effect_handler_BALL;
	} else if (die < 86) {
		subtype = PROJ_ACID;
		value.base = 40 + plev;
		radius = 2;
		handler = effect_handler_BALL;
	} else if (die < 91) {
		subtype = PROJ_ICE;
		value.base = 70 + plev;
		radius = 3;
		handler = effect_handler_BALL;
	} else if (die < 96) {
		subtype = PROJ_FIRE;
		value.base = 80 + plev;
		radius = 3;
		handler = effect_handler_BALL;
	} else if (die < 101) {
		subtype = PROJ_MON_DRAIN;
		value.base = 100 + plev;
		handler = effect_handler_BOLT;
	} else if (die < 104) {
		radius = 12;
		handler = effect_handler_EARTHQUAKE;
	} else if (die < 106) {
		radius = 15;
		handler = effect_handler_DESTRUCTION;
	} else if (die < 108) {
		handler = effect_handler_BANISH;
	} else if (die < 110) {
		subtype = PROJ_DISP_ALL;
		value.base = 120;
		handler = effect_handler_PROJECT_LOS;
	}

	if (handler != NULL) {
		effect_handler_context_t new_context = {
			context->effect,
			context->origin,
			context->obj,
			context->aware,
			context->dir,
			beam,
			context->boost,
			value,
			subtype, radius, other, y, x,
			NULL,
			context->ident,
			context->cmd
		};

		return handler(&new_context);
	} else {
		/* RARE */
		effect_simple(EF_PROJECT_LOS, context->origin, "150", PROJ_DISP_ALL, 0, 0, 0, 0, NULL);
		effect_simple(EF_PROJECT_LOS, context->origin, "20", PROJ_MON_SLOW, 0, 0, 0, 0, NULL);
		effect_simple(EF_PROJECT_LOS, context->origin, "40", PROJ_SLEEP_ALL, 0, 0, 0, 0, NULL);
		effect_simple(EF_HEAL_HP, context->origin, "300", 0, 0, 0, 0, 0, NULL);

		return true;
	}
}